

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O0

bool __thiscall Variable::unify(Variable *this,Term *t)

{
  int iVar1;
  Term *in_RSI;
  Variable *in_RDI;
  bool local_1;
  
  if ((Variable *)in_RDI->instance == in_RDI) {
    Trace::Push(in_RDI);
    in_RDI->instance = in_RSI;
    local_1 = true;
  }
  else {
    iVar1 = (*in_RDI->instance->_vptr_Term[1])(in_RDI->instance,in_RSI);
    local_1 = (bool)((byte)iVar1 & 1);
  }
  return local_1;
}

Assistant:

bool Variable::unify(Term *t)
{
    if (instance == this) {
        // The variable is uninstantiated.
        // Bind it to this term.
        Trace::Push(this);
        instance = t;
        return true;
    }

    // This variable is already instantiated.
    // Redirect the request to the instance.
    return instance->unify(t);
}